

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int * __thiscall google::protobuf::RepeatedField<int>::at(RepeatedField<int> *this,int index)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/repeated_field.h"
               ,0x49f);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4a0);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (int *)((long)index * 4 + (long)this->arena_or_elements_);
}

Assistant:

inline const Element& RepeatedField<Element>::at(int index) const {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}